

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

iterator __thiscall
pybind11::detail::
make_iterator_impl<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>
          (detail *this,
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
          first,_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>
                last)

{
  type_info *ptVar1;
  class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
  *this_00;
  object extraout_RDX;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  iterator iVar3;
  type_index local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  object local_38;
  type local_2b;
  type local_2a;
  return_value_policy local_29;
  
  local_50._M_target =
       (type_info *)
       &iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>
        ::typeinfo;
  ptVar1 = get_type_info(&local_50,false);
  if (ptVar1 == (type_info *)0x0) {
    local_38.super_handle.m_ptr._0_1_ = 1;
    class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>_>
    ::class_<pybind11::module_local>
              ((class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>,_(pybind11::return_value_policy)6,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_&>_>
                *)&local_50,(handle)0x0,"iterator",(module_local *)&local_38);
    this_00 = (class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
               *)class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
                 ::
                 def<pybind11::detail::make_iterator_impl<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>(std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>)::_lambda(pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>&)_1_>
                           ((class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
                             *)&local_50,"__iter__",&local_2b);
    local_29 = reference_internal;
    class_<pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>>
    ::
    def<pybind11::detail::make_iterator_impl<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>(std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>)::_lambda(pybind11::detail::iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>&)_2_,pybind11::return_value_policy>
              (this_00,"__next__",&local_2a,&local_29);
    object::~object((object *)&local_50);
  }
  local_40 = 1;
  local_50._M_target = (type_info *)first._M_node;
  local_48 = last._M_node;
  pVar2 = type_caster_generic::src_and_type
                    (&local_50,
                     (type_info *)
                     &iterator_state<pybind11::detail::iterator_access<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>,(pybind11::return_value_policy)6,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>const&>
                      ::typeinfo,(type_info *)0x0);
  local_38.super_handle =
       type_caster_generic::cast
                 (pVar2.first,move,(handle)0x0,pVar2.second,
                  ::anon_func::anon_class_1_0_00000001::__invoke,
                  ::anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  iterator::iterator((iterator *)this,&local_38);
  object::~object(&local_38);
  iVar3.value.super_handle.m_ptr = extraout_RDX.super_handle.m_ptr;
  iVar3.super_object.super_handle.m_ptr = (handle)(handle)this;
  return iVar3;
}

Assistant:

iterator make_iterator_impl(Iterator first, Sentinel last, Extra &&... extra) {
    using state = detail::iterator_state<Access, Policy, Iterator, Sentinel, ValueType, Extra...>;
    // TODO: state captures only the types of Extra, not the values

    if (!detail::get_type_info(typeid(state), false)) {
        class_<state>(handle(), "iterator", pybind11::module_local())
            .def("__iter__", [](state &s) -> state& { return s; })
            .def("__next__", [](state &s) -> ValueType {
                if (!s.first_or_done)
                    ++s.it;
                else
                    s.first_or_done = false;
                if (s.it == s.end) {
                    s.first_or_done = true;
                    throw stop_iteration();
                }
                return Access()(s.it);
            // NOLINTNEXTLINE(readability-const-return-type) // PR #3263
            }, std::forward<Extra>(extra)..., Policy);
    }

    return cast(state{first, last, true});
}